

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

CURLcode Curl_ws_request(Curl_easy *data,dynbuf *req)

{
  char *__s;
  CURLcode CVar1;
  size_t thislen;
  char *pcVar2;
  ulong uVar3;
  char **ppcVar4;
  char *randstr;
  size_t randlen;
  uchar rand [16];
  wsfield heads [4];
  char keyval [40];
  
  heads[3].name = "Sec-WebSocket-Key";
  heads[2].name = "Sec-WebSocket-Version";
  heads[2].val = "13";
  heads[1].name = "Connection";
  heads[1].val = "Upgrade";
  heads[0].name = "Upgrade";
  heads[0].val = "websocket";
  heads[3].val = keyval;
  CVar1 = Curl_rand_bytes(data,rand,0x10);
  if (CVar1 == CURLE_OK) {
    CVar1 = Curl_base64_encode((char *)rand,0x10,&randstr,&randlen);
    if (CVar1 == CURLE_OK) {
      if (randlen < 0x28) {
        strcpy(keyval,randstr);
        (*Curl_cfree)(randstr);
        ppcVar4 = &heads[0].val;
        CVar1 = CURLE_OK;
        for (uVar3 = 0; (CVar1 == CURLE_OK && (uVar3 < 4)); uVar3 = uVar3 + 1) {
          __s = ((wsfield *)(ppcVar4 + -1))->name;
          thislen = strlen(__s);
          pcVar2 = Curl_checkheaders(data,__s,thislen);
          CVar1 = CURLE_OK;
          if (pcVar2 == (char *)0x0) {
            CVar1 = Curl_dyn_addf(req,"%s: %s\r\n",__s,*ppcVar4);
          }
          ppcVar4 = ppcVar4 + 2;
        }
        (data->req).upgr101 = UPGR101_WS;
      }
      else {
        (*Curl_cfree)(randstr);
        CVar1 = CURLE_FAILED_INIT;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ws_request(struct Curl_easy *data, struct dynbuf *req)
{
  unsigned int i;
  CURLcode result = CURLE_OK;
  unsigned char rand[16];
  char *randstr;
  size_t randlen;
  char keyval[40];
  struct SingleRequest *k = &data->req;
  struct wsfield heads[]= {
    {
      /* The request MUST contain an |Upgrade| header field whose value
         MUST include the "websocket" keyword. */
      "Upgrade", "websocket"
    },
    {
      /* The request MUST contain a |Connection| header field whose value
         MUST include the "Upgrade" token. */
      "Connection", "Upgrade",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Version|. The value of this header field MUST be
         13. */
      "Sec-WebSocket-Version", "13",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Key|. The value of this header field MUST be a nonce
         consisting of a randomly selected 16-byte value that has been
         base64-encoded (see Section 4 of [RFC4648]). The nonce MUST be
         selected randomly for each connection. */
      "Sec-WebSocket-Key", NULL,
    }
  };
  heads[3].val = &keyval[0];

  /* 16 bytes random */
  result = Curl_rand(data, (unsigned char *)rand, sizeof(rand));
  if(result)
    return result;
  result = Curl_base64_encode((char *)rand, sizeof(rand), &randstr, &randlen);
  if(result)
    return result;
  DEBUGASSERT(randlen < sizeof(keyval));
  if(randlen >= sizeof(keyval)) {
    free(randstr);
    return CURLE_FAILED_INIT;
  }
  strcpy(keyval, randstr);
  free(randstr);
  for(i = 0; !result && (i < CURL_ARRAYSIZE(heads)); i++) {
    if(!Curl_checkheaders(data, heads[i].name, strlen(heads[i].name))) {
      result = Curl_dyn_addf(req, "%s: %s\r\n", heads[i].name,
                             heads[i].val);
    }
  }
  k->upgr101 = UPGR101_WS;
  return result;
}